

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool wallet::HaveKey(SigningProvider *wallet,CKey *key)

{
  array<unsigned_char,_32UL> *pbegin;
  int iVar1;
  undefined1 uVar2;
  long in_FS_OFFSET;
  CKey key2;
  CKey local_e8;
  CPubKey local_d2;
  CKeyID local_91;
  CPubKey local_7d;
  CKeyID local_3c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8.fCompressed = false;
  local_e8.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  pbegin = (key->keydata)._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  CKey::Set<std::byte_const*>
            (&local_e8,pbegin->_M_elems,pbegin[pbegin != (array<unsigned_char,_32UL> *)0x0]._M_elems
             ,(bool)(key->fCompressed ^ 1));
  CKey::GetPubKey(&local_7d,key);
  CPubKey::GetID(&local_3c,&local_7d);
  iVar1 = (*wallet->_vptr_SigningProvider[6])(wallet,&local_3c);
  uVar2 = 1;
  if ((char)iVar1 == '\0') {
    CKey::GetPubKey(&local_d2,&local_e8);
    CPubKey::GetID(&local_91,&local_d2);
    iVar1 = (*wallet->_vptr_SigningProvider[6])(wallet,&local_91);
    uVar2 = (undefined1)iVar1;
  }
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_e8.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool HaveKey(const SigningProvider& wallet, const CKey& key)
{
    CKey key2;
    key2.Set(key.begin(), key.end(), !key.IsCompressed());
    return wallet.HaveKey(key.GetPubKey().GetID()) || wallet.HaveKey(key2.GetPubKey().GetID());
}